

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O0

void __thiscall EncodingTable::~EncodingTable(EncodingTable *this)

{
  EncodingTable *this_local;
  
  std::vector<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>::~vector
            (&this->entries);
  std::__cxx11::wstring::~wstring((wstring *)&this->valueData);
  ByteArray::~ByteArray(&this->hexData);
  return;
}

Assistant:

EncodingTable::~EncodingTable()
{

}